

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O1

void GD::predict<true,false>(gd *g,base_learner *param_2,example *ec)

{
  vw *pvVar1;
  float fVar2;
  trunc_data local_18;
  
  pvVar1 = g->all;
  local_18.gravity = (float)pvVar1->sd->gravity;
  local_18.prediction = (ec->l).simple.initial;
  if ((pvVar1->weights).sparse == true) {
    foreach_feature<GD::trunc_data,_float_&,_&GD::vec_add_trunc,_sparse_parameters>
              (&(pvVar1->weights).sparse_weights,pvVar1->ignore_some_linear,pvVar1->ignore_linear,
               &pvVar1->interactions,pvVar1->permutations,&ec->super_example_predict,&local_18);
  }
  else {
    foreach_feature<GD::trunc_data,_float_&,_&GD::vec_add_trunc,_dense_parameters>
              (&(pvVar1->weights).dense_weights,pvVar1->ignore_some_linear,pvVar1->ignore_linear,
               &pvVar1->interactions,pvVar1->permutations,&ec->super_example_predict,&local_18);
  }
  ec->partial_prediction = local_18.prediction;
  fVar2 = (float)pvVar1->sd->contraction * local_18.prediction;
  ec->partial_prediction = fVar2;
  fVar2 = finalize_prediction(pvVar1->sd,fVar2);
  (ec->pred).scalar = fVar2;
  return;
}

Assistant:

void predict(gd& g, base_learner&, example& ec)
{
  vw& all = *g.all;
  if (l1)
    ec.partial_prediction = trunc_predict(all, ec, all.sd->gravity);
  else
    ec.partial_prediction = inline_predict(all, ec);

  ec.partial_prediction *= (float)all.sd->contraction;
  ec.pred.scalar = finalize_prediction(all.sd, ec.partial_prediction);
  if (audit)
    print_audit_features(all, ec);
}